

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dinic_test.cpp
# Opt level: O3

void __thiscall Dinic_BenchmarkV100E10000_Test::TestBody(Dinic_BenchmarkV100E10000_Test *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 local_a0 [8];
  Dinic d;
  
  srand(1);
  Dinic::Dinic((Dinic *)local_a0,100);
  iVar4 = 30000;
  do {
    iVar1 = rand();
    iVar2 = rand();
    iVar3 = rand();
    Dinic::addEdge((Dinic *)local_a0,iVar1 % 100,iVar2 % 100,(ulong)(iVar3 % 1000 + 1000));
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  Dinic::getFlow((Dinic *)local_a0,0,99);
  if (d.d.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(d.d.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (d.g.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(d.g.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&d.e.super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  if (d._8_8_ != 0) {
    operator_delete((void *)d._8_8_);
  }
  return;
}

Assistant:

TEST(Dinic, BenchmarkV100E10000) {
    srand(1);
    int n = 100;
    int m = 30000;
    int range = 1000;
    Dinic d(n);
    rep(i, 0, m) {
        d.addEdge(rand() % n, rand() % n, range + rand() % range);
    }
    d.getFlow(0, n - 1);
}